

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall bloaty::MmapInputFile::~MmapInputFile(MmapInputFile *this)

{
  pointer pcVar1;
  int iVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  MmapInputFile *this_00;
  
  (this->super_InputFile)._vptr_InputFile = (_func_int **)&PTR_TryOpen_00628fd0;
  this_00 = (MmapInputFile *)(this->super_InputFile).data_._M_str;
  if (this_00 != (MmapInputFile *)0x0) {
    iVar2 = munmap(this_00,(this->super_InputFile).data_._M_len);
    if (iVar2 != 0) {
      ~MmapInputFile(this_00);
    }
  }
  (this->super_InputFile)._vptr_InputFile = (_func_int **)&PTR___cxa_pure_virtual_006290f0;
  pcVar1 = (this->super_InputFile).filename_._M_dataplus._M_p;
  paVar3 = &(this->super_InputFile).filename_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

MmapInputFile::~MmapInputFile() {
  if (data_.data() != nullptr &&
      munmap(const_cast<char*>(data_.data()), data_.size()) != 0) {
    fprintf(stderr, "bloaty: error calling munmap(): %s\n", strerror(errno));
  }
}